

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void geopolyBBoxFinal(sqlite3_context *context)

{
  _func_void_void_ptr *xDel;
  GeoPoly *pGVar1;
  void *in_RDI;
  GeoBBox *pBBox;
  GeoPoly *p;
  RtreeCoord *in_stack_00000018;
  sqlite3_value *in_stack_00000020;
  sqlite3_context *in_stack_00000028;
  
  xDel = (_func_void_void_ptr *)
         sqlite3_aggregate_context((sqlite3_context *)&DAT_aaaaaaaaaaaaaaaa,0);
  if ((xDel != (_func_void_void_ptr *)0x0) &&
     (pGVar1 = geopolyBBox(in_stack_00000028,in_stack_00000020,in_stack_00000018,(int *)context),
     pGVar1 != (GeoPoly *)0x0)) {
    sqlite3_result_blob((sqlite3_context *)pBBox,in_RDI,(int)((ulong)pGVar1 >> 0x20),xDel);
    sqlite3_free((void *)0x2a0b6a);
  }
  return;
}

Assistant:

static void geopolyBBoxFinal(
  sqlite3_context *context
){
  GeoPoly *p;
  GeoBBox *pBBox;
  pBBox = (GeoBBox*)sqlite3_aggregate_context(context, 0);
  if( pBBox==0 ) return;
  p = geopolyBBox(context, 0, pBBox->a, 0);
  if( p ){
    sqlite3_result_blob(context, p->hdr,
       4+8*p->nVertex, SQLITE_TRANSIENT);
    sqlite3_free(p);
  }
}